

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O0

void __thiscall pbrt::HaltonPixelIndexer::SetPixel(HaltonPixelIndexer *this,Point2i *p)

{
  int iVar1;
  int *piVar2;
  Tuple2<pbrt::Point2,_int> *in_RSI;
  Tuple2<pbrt::Point2,_int> *in_RDI;
  uint64_t dimOffset;
  int i;
  Point2i pm;
  int sampleStride;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint64_t local_48;
  int local_20;
  Tuple2<pbrt::Point2,_int> local_1c;
  int local_14;
  Tuple2<pbrt::Point2,_int> *local_10;
  
  in_RDI[3].x = 0;
  in_RDI[3].y = 0;
  local_10 = in_RSI;
  piVar2 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
  iVar1 = *piVar2;
  piVar2 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
  local_14 = iVar1 * *piVar2;
  if (1 < local_14) {
    iVar1 = Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
    Mod<int>(iVar1,0x80);
    iVar1 = Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
    Mod<int>(iVar1,0x80);
    Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                        ,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98);
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      if (local_20 == 0) {
        piVar2 = Tuple2<pbrt::Point2,_int>::operator[](&local_1c,0);
        iVar1 = *piVar2;
        piVar2 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI + 1,0);
        local_48 = InverseRadicalInverse<2>((long)iVar1,*piVar2);
      }
      else {
        piVar2 = Tuple2<pbrt::Point2,_int>::operator[](&local_1c,local_20);
        iVar1 = *piVar2;
        piVar2 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI + 1,local_20);
        local_48 = InverseRadicalInverse<3>((long)iVar1,*piVar2);
      }
      iVar1 = local_14;
      piVar2 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,local_20);
      in_RDI[3] = (Tuple2<pbrt::Point2,_int>)
                  (local_48 * (long)(iVar1 / *piVar2) * (long)(&in_RDI[2].x)[local_20] +
                  (long)in_RDI[3]);
    }
    in_RDI[3] = (Tuple2<pbrt::Point2,_int>)((long)in_RDI[3] % (long)local_14);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetPixel(const Point2i &p) {
        pixelSampleForIndex = 0;

        int sampleStride = baseScales[0] * baseScales[1];
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse<2>(pm[i], baseExponents[i])
                             : InverseRadicalInverse<3>(pm[i], baseExponents[i]);
                pixelSampleForIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            pixelSampleForIndex %= sampleStride;
        }
    }